

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::sbc_a_b(CPU *this)

{
  sbc_r8_r8(this,&this->regs->a,this->regs->b);
  return 1;
}

Assistant:

int CPU::sbc_a_b() {
    sbc_r8_r8(regs.a, regs.b);
    return 1;
}